

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<pollfd>::emplace<pollfd>
          (QPodArrayOps<pollfd> *this,qsizetype i,pollfd *args)

{
  pollfd **pppVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  pollfd pVar4;
  pollfd *ppVar5;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<pollfd>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_003c4b15:
    pVar4 = *args;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<pollfd>).size != 0);
    QArrayDataPointer<pollfd>::detachAndGrow
              (&this->super_QArrayDataPointer<pollfd>,where,1,(pollfd **)0x0,
               (QArrayDataPointer<pollfd> *)0x0);
    ppVar5 = createHole(this,where,i,1);
    *ppVar5 = pVar4;
  }
  else {
    if (((this->super_QArrayDataPointer<pollfd>).size == i) &&
       (ppVar5 = (this->super_QArrayDataPointer<pollfd>).ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)ppVar5 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
       i)) {
      ppVar5[i] = *args;
    }
    else {
      if ((i != 0) ||
         (ppVar5 = (this->super_QArrayDataPointer<pollfd>).ptr,
         (pollfd *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         ppVar5)) goto LAB_003c4b15;
      ppVar5[-1] = *args;
      pppVar1 = &(this->super_QArrayDataPointer<pollfd>).ptr;
      *pppVar1 = *pppVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<pollfd>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }